

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O1

bool TestEvaluation(ExpressionContext *ctx,VmModule *module,char *resultBuf,uint resultBufSize,
                   char *errorBuf,uint errorBufSize)

{
  bool bVar1;
  InstructionVMEvalContext evalCtx;
  InstructionVMEvalContext local_348;
  
  local_348.stackFrames.allocator = ctx->allocator;
  local_348.stackFrames.data = local_348.stackFrames.little;
  local_348.stackFrames.count = 0;
  local_348.stackFrames.max = 0x20;
  local_348.heap.functionOwner = (VmFunction *)0x0;
  local_348.heap.tag = "heap";
  local_348.heap.index = 0;
  local_348.heap.data.data = local_348.heap.data.little;
  local_348.heap.data.count = 0;
  local_348.heap.data.max = 0x80;
  local_348.heap.expired = false;
  local_348.storageSet.data = local_348.storageSet.little;
  local_348.storageSet.count = 0;
  local_348.storageSet.max = 0x20;
  local_348.hasError = false;
  local_348.globalFrame = (StackFrame *)0x0;
  local_348.emulateKnownExternals = true;
  local_348.printExecution = false;
  local_348.stackDepthLimit = 0x40;
  local_348.heapSize = 0;
  local_348.frameMemoryLimit = 0x2000;
  local_348.variableMemoryLimit = 0x1000;
  local_348.instruction = 0;
  local_348.instructionsLimit = 0x10000;
  local_348.ctx = ctx;
  local_348.errorBuf = errorBuf;
  local_348.errorBufSize = errorBufSize;
  local_348.heap.data.allocator = local_348.stackFrames.allocator;
  local_348.storageSet.allocator = local_348.stackFrames.allocator;
  local_348.allocator = local_348.stackFrames.allocator;
  bVar1 = EvaluateToBuffer(&local_348,module,resultBuf,resultBufSize);
  SmallArray<InstructionVMEvalContext::Storage_*,_32U>::~SmallArray(&local_348.storageSet);
  SmallArray<char,_128U>::~SmallArray(&local_348.heap.data);
  SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::~SmallArray(&local_348.stackFrames);
  return bVar1;
}

Assistant:

bool TestEvaluation(ExpressionContext &ctx, VmModule *module, char *resultBuf, unsigned resultBufSize, char *errorBuf, unsigned errorBufSize)
{
	InstructionVMEvalContext evalCtx(ctx, ctx.allocator);

	evalCtx.errorBuf = errorBuf;
	evalCtx.errorBufSize = errorBufSize;

	evalCtx.emulateKnownExternals = true;

	return EvaluateToBuffer(evalCtx, module, resultBuf, resultBufSize);
}